

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeLowerStatus(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,int i,
                   number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *newLower,
                   number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *oldLower)

{
  fpclass_type fVar1;
  int32_t iVar2;
  Status *pSVar3;
  pointer pnVar4;
  Real RVar5;
  bool bVar6;
  int iVar7;
  Status SVar8;
  int iVar9;
  fpclass_type fVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  undefined8 *puVar13;
  long lVar14;
  uint *puVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  pointer pnVar17;
  pointer pnVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  pointer pnVar20;
  byte bVar21;
  long in_FS_OFFSET;
  byte bVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  currUpper;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<200U,_int,_void> local_6c8;
  double local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined5 uStack_5d0;
  undefined3 uStack_5cb;
  int iStack_5c8;
  byte bStack_5c4;
  undefined8 local_5c0;
  cpp_dec_float<200U,_int,_void> local_5b8;
  cpp_dec_float<200U,_int,_void> local_538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined5 uStack_3d0;
  undefined3 uStack_3cb;
  undefined5 uStack_3c8;
  undefined8 local_3c0;
  cpp_dec_float<200U,_int,_void> local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar22 = 0;
  pSVar3 = (this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.colstat.data;
  pnVar4 = (this->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar15 = (uint *)(pnVar4 + i);
  pcVar12 = &local_538;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pcVar12->data)._M_elems[0] = *puVar15;
    puVar15 = puVar15 + 1;
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)((pcVar12->data)._M_elems + 1);
  }
  iVar7 = pnVar4[i].m_backend.exp;
  bVar6 = pnVar4[i].m_backend.neg;
  fVar1 = pnVar4[i].m_backend.fpclass;
  iVar2 = pnVar4[i].m_backend.prec_elem;
  local_5c0._0_4_ = cpp_dec_float_finite;
  local_5c0._4_4_ = 0x1c;
  local_638 = 0;
  uStack_630 = 0;
  local_628 = 0;
  uStack_620 = 0;
  local_618 = 0;
  uStack_610 = 0;
  local_608 = 0;
  uStack_600 = 0;
  local_5f8 = 0;
  uStack_5f0 = 0;
  local_5e8 = 0;
  uStack_5e0 = 0;
  local_5d8 = 0;
  uStack_5d0 = 0;
  uStack_5cb = 0;
  iStack_5c8 = 0;
  bStack_5c4 = 0;
  local_538.exp = iVar7;
  local_538.neg = bVar6;
  local_538.fpclass = fVar1;
  local_538.prec_elem = iVar2;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_638,0.0);
  switch(pSVar3[i]) {
  case D_FREE:
  case D_ON_UPPER:
  case D_ON_LOWER:
  case D_ON_BOTH:
  case D_UNDEFINED:
    if ((this->theRep == ROW) && ((this->theShift).m_backend.fpclass != cpp_dec_float_NaN)) {
      local_6c8.fpclass = cpp_dec_float_finite;
      local_6c8.prec_elem = 0x1c;
      local_6c8.data._M_elems[0] = 0;
      local_6c8.data._M_elems[1] = 0;
      local_6c8.data._M_elems[2] = 0;
      local_6c8.data._M_elems[3] = 0;
      local_6c8.data._M_elems[4] = 0;
      local_6c8.data._M_elems[5] = 0;
      local_6c8.data._M_elems[6] = 0;
      local_6c8.data._M_elems[7] = 0;
      local_6c8.data._M_elems[8] = 0;
      local_6c8.data._M_elems[9] = 0;
      local_6c8.data._M_elems[10] = 0;
      local_6c8.data._M_elems[0xb] = 0;
      local_6c8.data._M_elems[0xc] = 0;
      local_6c8.data._M_elems[0xd] = 0;
      local_6c8.data._M_elems[0xe] = 0;
      local_6c8.data._M_elems[0xf] = 0;
      local_6c8.data._M_elems[0x10] = 0;
      local_6c8.data._M_elems[0x11] = 0;
      local_6c8.data._M_elems[0x12] = 0;
      local_6c8.data._M_elems[0x13] = 0;
      local_6c8.data._M_elems[0x14] = 0;
      local_6c8.data._M_elems[0x15] = 0;
      local_6c8.data._M_elems[0x16] = 0;
      local_6c8.data._M_elems[0x17] = 0;
      local_6c8.data._M_elems[0x18] = 0;
      local_6c8.data._M_elems[0x19] = 0;
      local_6c8.data._M_elems._104_5_ = 0;
      local_6c8.data._M_elems[0x1b]._1_3_ = 0;
      local_6c8.exp = 0;
      local_6c8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_6c8,0.0);
      iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&(this->theShift).m_backend,&local_6c8);
      if (0 < iVar7) {
        pcVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
        pcVar12 = pcVar11;
        pnVar16 = &this->m_nonbasicValue;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + (ulong)bVar22 * -8 + 4);
        }
        (this->m_nonbasicValue).m_backend.exp = pcVar11->exp;
        (this->m_nonbasicValue).m_backend.neg = pcVar11->neg;
        iVar2 = pcVar11->prec_elem;
        (this->m_nonbasicValue).m_backend.fpclass = pcVar11->fpclass;
        (this->m_nonbasicValue).m_backend.prec_elem = iVar2;
        this->m_nonbasicValueUpToDate = false;
      }
    }
    SVar8 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dualColStatus(&this->
                             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ,i);
    pSVar3[i] = SVar8;
    break;
  case P_FIXED:
    pnVar16 = newLower;
    pnVar19 = &local_230;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = (newLower->m_backend).exp;
    local_230.m_backend.neg = (newLower->m_backend).neg;
    local_230.m_backend.fpclass = (newLower->m_backend).fpclass;
    local_230.m_backend.prec_elem = (newLower->m_backend).prec_elem;
    pcVar12 = &local_538;
    pnVar16 = &local_2b0;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = iVar7;
    local_2b0.m_backend.neg = bVar6;
    local_2b0.m_backend.fpclass = fVar1;
    local_2b0.m_backend.prec_elem = iVar2;
    RVar5 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar6 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_230,&local_2b0,RVar5);
    if ((bVar6) && (pSVar3[i] = P_ON_UPPER, this->initialized == true)) {
      pnVar4 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar18 = (this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar17 = pnVar4 + i;
      pnVar20 = pnVar18 + i;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      pnVar18[i].m_backend.exp = pnVar4[i].m_backend.exp;
      pnVar18[i].m_backend.neg = pnVar4[i].m_backend.neg;
      iVar2 = pnVar4[i].m_backend.prec_elem;
      pnVar18[i].m_backend.fpclass = pnVar4[i].m_backend.fpclass;
      pnVar18[i].m_backend.prec_elem = iVar2;
    }
    break;
  default:
    puVar13 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_6c8.data._M_elems._0_8_ = local_6c8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6c8,"XCHANG01 This should never happen.","");
    *puVar13 = &PTR__SPxException_0069d438;
    puVar13[1] = puVar13 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar13 + 1),local_6c8.data._M_elems._0_8_,
               local_6c8.data._M_elems._0_8_ + local_6c8.data._M_elems._8_8_);
    *puVar13 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar13,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    ::soplex::infinity::__tls_init();
    local_648 = *(double *)(in_FS_OFFSET + -8);
    uStack_640 = 0;
    local_6c8.fpclass = cpp_dec_float_finite;
    local_6c8.prec_elem = 0x1c;
    local_6c8.data._M_elems[0] = 0;
    local_6c8.data._M_elems[1] = 0;
    local_6c8.data._M_elems[2] = 0;
    local_6c8.data._M_elems[3] = 0;
    local_6c8.data._M_elems[4] = 0;
    local_6c8.data._M_elems[5] = 0;
    local_6c8.data._M_elems[6] = 0;
    local_6c8.data._M_elems[7] = 0;
    local_6c8.data._M_elems[8] = 0;
    local_6c8.data._M_elems[9] = 0;
    local_6c8.data._M_elems[10] = 0;
    local_6c8.data._M_elems[0xb] = 0;
    local_6c8.data._M_elems[0xc] = 0;
    local_6c8.data._M_elems[0xd] = 0;
    local_6c8.data._M_elems[0xe] = 0;
    local_6c8.data._M_elems[0xf] = 0;
    local_6c8.data._M_elems[0x10] = 0;
    local_6c8.data._M_elems[0x11] = 0;
    local_6c8.data._M_elems[0x12] = 0;
    local_6c8.data._M_elems[0x13] = 0;
    local_6c8.data._M_elems[0x14] = 0;
    local_6c8.data._M_elems[0x15] = 0;
    local_6c8.data._M_elems[0x16] = 0;
    local_6c8.data._M_elems[0x17] = 0;
    local_6c8.data._M_elems[0x18] = 0;
    local_6c8.data._M_elems[0x19] = 0;
    local_6c8.data._M_elems._104_5_ = 0;
    local_6c8.data._M_elems[0x1b]._1_3_ = 0;
    local_6c8.exp = 0;
    local_6c8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_6c8,-local_648);
    fVar10 = (newLower->m_backend).fpclass;
    if ((fVar10 != cpp_dec_float_NaN) && (local_6c8.fpclass != cpp_dec_float_NaN)) {
      iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&newLower->m_backend,&local_6c8);
      if (iVar9 < 1) {
        ::soplex::infinity::__tls_init();
        local_6c8.fpclass = cpp_dec_float_finite;
        local_6c8.prec_elem = 0x1c;
        local_6c8.data._M_elems[0] = 0;
        local_6c8.data._M_elems[1] = 0;
        local_6c8.data._M_elems[2] = 0;
        local_6c8.data._M_elems[3] = 0;
        local_6c8.data._M_elems[4] = 0;
        local_6c8.data._M_elems[5] = 0;
        local_6c8.data._M_elems[6] = 0;
        local_6c8.data._M_elems[7] = 0;
        local_6c8.data._M_elems[8] = 0;
        local_6c8.data._M_elems[9] = 0;
        local_6c8.data._M_elems[10] = 0;
        local_6c8.data._M_elems[0xb] = 0;
        local_6c8.data._M_elems[0xc] = 0;
        local_6c8.data._M_elems[0xd] = 0;
        local_6c8.data._M_elems[0xe] = 0;
        local_6c8.data._M_elems[0xf] = 0;
        local_6c8.data._M_elems[0x10] = 0;
        local_6c8.data._M_elems[0x11] = 0;
        local_6c8.data._M_elems[0x12] = 0;
        local_6c8.data._M_elems[0x13] = 0;
        local_6c8.data._M_elems[0x14] = 0;
        local_6c8.data._M_elems[0x15] = 0;
        local_6c8.data._M_elems[0x16] = 0;
        local_6c8.data._M_elems[0x17] = 0;
        local_6c8.data._M_elems[0x18] = 0;
        local_6c8.data._M_elems[0x19] = 0;
        local_6c8.data._M_elems._104_5_ = 0;
        local_6c8.data._M_elems[0x1b]._1_3_ = 0;
        local_6c8.exp = 0;
        local_6c8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_6c8,local_648);
        if ((fVar1 == cpp_dec_float_NaN) || (local_6c8.fpclass == cpp_dec_float_NaN)) {
LAB_004df9b3:
          pSVar3[i] = P_ON_UPPER;
          if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
          local_5b8.fpclass = cpp_dec_float_finite;
          local_5b8.prec_elem = 0x1c;
          local_5b8.data._M_elems[0] = 0;
          local_5b8.data._M_elems[1] = 0;
          local_5b8.data._M_elems[2] = 0;
          local_5b8.data._M_elems[3] = 0;
          local_5b8.data._M_elems[4] = 0;
          local_5b8.data._M_elems[5] = 0;
          local_5b8.data._M_elems[6] = 0;
          local_5b8.data._M_elems[7] = 0;
          local_5b8.data._M_elems[8] = 0;
          local_5b8.data._M_elems[9] = 0;
          local_5b8.data._M_elems[10] = 0;
          local_5b8.data._M_elems[0xb] = 0;
          local_5b8.data._M_elems[0xc] = 0;
          local_5b8.data._M_elems[0xd] = 0;
          local_5b8.data._M_elems[0xe] = 0;
          local_5b8.data._M_elems[0xf] = 0;
          local_5b8.data._M_elems[0x10] = 0;
          local_5b8.data._M_elems[0x11] = 0;
          local_5b8.data._M_elems[0x12] = 0;
          local_5b8.data._M_elems[0x13] = 0;
          local_5b8.data._M_elems[0x14] = 0;
          local_5b8.data._M_elems[0x15] = 0;
          local_5b8.data._M_elems[0x16] = 0;
          local_5b8.data._M_elems[0x17] = 0;
          local_5b8.data._M_elems[0x18] = 0;
          local_5b8.data._M_elems[0x19] = 0;
          local_5b8.data._M_elems._104_5_ = 0;
          local_5b8.data._M_elems[0x1b]._1_3_ = 0;
          local_5b8.exp = 0;
          local_5b8.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_5b8,
                     &(this->theUCbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&local_538);
          local_3b8.fpclass = cpp_dec_float_finite;
          local_3b8.prec_elem = 0x1c;
          local_3b8.data._M_elems[0] = 0;
          local_3b8.data._M_elems[1] = 0;
          local_3b8.data._M_elems[2] = 0;
          local_3b8.data._M_elems[3] = 0;
          local_3b8.data._M_elems[4] = 0;
          local_3b8.data._M_elems[5] = 0;
          local_3b8.data._M_elems[6] = 0;
          local_3b8.data._M_elems[7] = 0;
          local_3b8.data._M_elems[8] = 0;
          local_3b8.data._M_elems[9] = 0;
          local_3b8.data._M_elems[10] = 0;
          local_3b8.data._M_elems[0xb] = 0;
          local_3b8.data._M_elems[0xc] = 0;
          local_3b8.data._M_elems[0xd] = 0;
          local_3b8.data._M_elems[0xe] = 0;
          local_3b8.data._M_elems[0xf] = 0;
          local_3b8.data._M_elems[0x10] = 0;
          local_3b8.data._M_elems[0x11] = 0;
          local_3b8.data._M_elems[0x12] = 0;
          local_3b8.data._M_elems[0x13] = 0;
          local_3b8.data._M_elems[0x14] = 0;
          local_3b8.data._M_elems[0x15] = 0;
          local_3b8.data._M_elems[0x16] = 0;
          local_3b8.data._M_elems[0x17] = 0;
          local_3b8.data._M_elems[0x18] = 0;
          local_3b8.data._M_elems[0x19] = 0;
          local_3b8.data._M_elems._104_5_ = 0;
          local_3b8.data._M_elems[0x1b]._1_3_ = 0;
          local_3b8.exp = 0;
          local_3b8.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_3b8,
                     &(this->theLCbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&oldLower->m_backend);
          local_6c8.fpclass = cpp_dec_float_finite;
          local_6c8.prec_elem = 0x1c;
          local_6c8.data._M_elems[0] = 0;
          local_6c8.data._M_elems[1] = 0;
          local_6c8.data._M_elems[2] = 0;
          local_6c8.data._M_elems[3] = 0;
          local_6c8.data._M_elems[4] = 0;
          local_6c8.data._M_elems[5] = 0;
          local_6c8.data._M_elems[6] = 0;
          local_6c8.data._M_elems[7] = 0;
          local_6c8.data._M_elems[8] = 0;
          local_6c8.data._M_elems[9] = 0;
          local_6c8.data._M_elems[10] = 0;
          local_6c8.data._M_elems[0xb] = 0;
          local_6c8.data._M_elems[0xc] = 0;
          local_6c8.data._M_elems[0xd] = 0;
          local_6c8.data._M_elems[0xe] = 0;
          local_6c8.data._M_elems[0xf] = 0;
          local_6c8.data._M_elems[0x10] = 0;
          local_6c8.data._M_elems[0x11] = 0;
          local_6c8.data._M_elems[0x12] = 0;
          local_6c8.data._M_elems[0x13] = 0;
          local_6c8.data._M_elems[0x14] = 0;
          local_6c8.data._M_elems[0x15] = 0;
          local_6c8.data._M_elems[0x16] = 0;
          local_6c8.data._M_elems[0x17] = 0;
          local_6c8.data._M_elems[0x18] = 0;
          local_6c8.data._M_elems[0x19] = 0;
          local_6c8.data._M_elems._104_5_ = 0;
          local_6c8.data._M_elems[0x1b]._1_3_ = 0;
          local_6c8.exp = 0;
          local_6c8.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_6c8,&local_5b8,&local_3b8);
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_538,&local_6c8);
          if (iVar7 < 0) goto LAB_004df9b3;
          pSVar3[i] = P_FREE;
          if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
          pnVar4 = (this->theLCbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar18 = pnVar4 + i;
          pcVar12 = &local_5b8;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar12->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
            pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
          }
          iVar7 = pnVar4[i].m_backend.exp;
          local_5b8.exp = iVar7;
          bVar21 = pnVar4[i].m_backend.neg;
          local_5b8.neg = (bool)bVar21;
          fVar1 = pnVar4[i].m_backend.fpclass;
          iVar2 = pnVar4[i].m_backend.prec_elem;
          local_5b8.prec_elem = iVar2;
          local_5b8.fpclass = fVar1;
          if (local_5b8.data._M_elems[0] != 0 || fVar1 != cpp_dec_float_finite) {
            bVar21 = bVar21 ^ 1;
            local_5b8.neg = (bool)bVar21;
          }
          local_6c8.fpclass = cpp_dec_float_finite;
          local_6c8.prec_elem = 0x1c;
          local_6c8.data._M_elems[0] = 0;
          local_6c8.data._M_elems[1] = 0;
          local_6c8.data._M_elems[2] = 0;
          local_6c8.data._M_elems[3] = 0;
          local_6c8.data._M_elems[4] = 0;
          local_6c8.data._M_elems[5] = 0;
          local_6c8.data._M_elems[6] = 0;
          local_6c8.data._M_elems[7] = 0;
          local_6c8.data._M_elems[8] = 0;
          local_6c8.data._M_elems[9] = 0;
          local_6c8.data._M_elems[10] = 0;
          local_6c8.data._M_elems[0xb] = 0;
          local_6c8.data._M_elems[0xc] = 0;
          local_6c8.data._M_elems[0xd] = 0;
          local_6c8.data._M_elems[0xe] = 0;
          local_6c8.data._M_elems[0xf] = 0;
          local_6c8.data._M_elems[0x10] = 0;
          local_6c8.data._M_elems[0x11] = 0;
          local_6c8.data._M_elems[0x12] = 0;
          local_6c8.data._M_elems[0x13] = 0;
          local_6c8.data._M_elems[0x14] = 0;
          local_6c8.data._M_elems[0x15] = 0;
          local_6c8.data._M_elems[0x16] = 0;
          local_6c8.data._M_elems[0x17] = 0;
          local_6c8.data._M_elems[0x18] = 0;
          local_6c8.data._M_elems[0x19] = 0;
          local_6c8.data._M_elems._104_5_ = 0;
          local_6c8.data._M_elems[0x1b]._1_3_ = 0;
          local_6c8.exp = 0;
          local_6c8.neg = false;
          pcVar12 = &local_5b8;
          local_5b8.neg = (bool)bVar21;
          if (&local_6c8 != &oldLower->m_backend) {
            pcVar12 = &local_5b8;
            pcVar11 = &local_6c8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar11->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar22 * -8 + 4);
            }
            local_6c8.prec_elem = iVar2;
            local_6c8.fpclass = fVar1;
            pcVar12 = &oldLower->m_backend;
            local_6c8.exp = iVar7;
            local_6c8.neg = (bool)bVar21;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_6c8,pcVar12);
        }
        pcVar12 = &local_6c8;
        puVar15 = (uint *)&local_638;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar15 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
        }
        iStack_5c8 = local_6c8.exp;
        bStack_5c4 = local_6c8.neg;
        goto LAB_004df80e;
      }
      fVar10 = (newLower->m_backend).fpclass;
    }
    pnVar16 = newLower;
    pnVar19 = &local_4b8;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_4b8.m_backend.exp = (newLower->m_backend).exp;
    local_4b8.m_backend.neg = (newLower->m_backend).neg;
    local_4b8.m_backend.fpclass = fVar10;
    local_4b8.m_backend.prec_elem = (newLower->m_backend).prec_elem;
    pcVar12 = &local_538;
    pnVar16 = &local_b0;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = iVar7;
    local_b0.m_backend.neg = bVar6;
    local_b0.m_backend.fpclass = fVar1;
    local_b0.m_backend.prec_elem = iVar2;
    RVar5 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    local_3c0 = 0x1c00000000;
    local_438 = 0;
    uStack_430 = 0;
    local_428 = 0;
    uStack_420 = 0;
    local_418 = 0;
    uStack_410 = 0;
    local_408 = 0;
    uStack_400 = 0;
    local_3f8 = 0;
    uStack_3f0 = 0;
    local_3e8 = 0;
    uStack_3e0 = 0;
    local_3d8 = 0;
    uStack_3d0 = 0;
    uStack_3cb = 0;
    uStack_3c8 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_438,RVar5);
    bVar6 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_4b8,&local_b0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_438);
    if (bVar6) {
      pSVar3[i] = P_FIXED;
      if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
      pnVar4 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
      pnVar4 = (this->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    local_5b8.fpclass = cpp_dec_float_finite;
    local_5b8.prec_elem = 0x1c;
    local_5b8.data._M_elems[0] = 0;
    local_5b8.data._M_elems[1] = 0;
    local_5b8.data._M_elems[2] = 0;
    local_5b8.data._M_elems[3] = 0;
    local_5b8.data._M_elems[4] = 0;
    local_5b8.data._M_elems[5] = 0;
    local_5b8.data._M_elems[6] = 0;
    local_5b8.data._M_elems[7] = 0;
    local_5b8.data._M_elems[8] = 0;
    local_5b8.data._M_elems[9] = 0;
    local_5b8.data._M_elems[10] = 0;
    local_5b8.data._M_elems[0xb] = 0;
    local_5b8.data._M_elems[0xc] = 0;
    local_5b8.data._M_elems[0xd] = 0;
    local_5b8.data._M_elems[0xe] = 0;
    local_5b8.data._M_elems[0xf] = 0;
    local_5b8.data._M_elems[0x10] = 0;
    local_5b8.data._M_elems[0x11] = 0;
    local_5b8.data._M_elems[0x12] = 0;
    local_5b8.data._M_elems[0x13] = 0;
    local_5b8.data._M_elems[0x14] = 0;
    local_5b8.data._M_elems[0x15] = 0;
    local_5b8.data._M_elems[0x16] = 0;
    local_5b8.data._M_elems[0x17] = 0;
    local_5b8.data._M_elems[0x18] = 0;
    local_5b8.data._M_elems[0x19] = 0;
    local_5b8.data._M_elems._104_5_ = 0;
    local_5b8.data._M_elems[0x1b]._1_3_ = 0;
    local_5b8.exp = 0;
    local_5b8.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_5b8,&newLower->m_backend,&oldLower->m_backend);
    local_6c8.fpclass = cpp_dec_float_finite;
    local_6c8.prec_elem = 0x1c;
    local_6c8.data._M_elems[0] = 0;
    local_6c8.data._M_elems[1] = 0;
    local_6c8.data._M_elems[2] = 0;
    local_6c8.data._M_elems[3] = 0;
    local_6c8.data._M_elems[4] = 0;
    local_6c8.data._M_elems[5] = 0;
    local_6c8.data._M_elems[6] = 0;
    local_6c8.data._M_elems[7] = 0;
    local_6c8.data._M_elems[8] = 0;
    local_6c8.data._M_elems[9] = 0;
    local_6c8.data._M_elems[10] = 0;
    local_6c8.data._M_elems[0xb] = 0;
    local_6c8.data._M_elems[0xc] = 0;
    local_6c8.data._M_elems[0xd] = 0;
    local_6c8.data._M_elems[0xe] = 0;
    local_6c8.data._M_elems[0xf] = 0;
    local_6c8.data._M_elems[0x10] = 0;
    local_6c8.data._M_elems[0x11] = 0;
    local_6c8.data._M_elems[0x12] = 0;
    local_6c8.data._M_elems[0x13] = 0;
    local_6c8.data._M_elems[0x14] = 0;
    local_6c8.data._M_elems[0x15] = 0;
    local_6c8.data._M_elems[0x16] = 0;
    local_6c8.data._M_elems[0x17] = 0;
    local_6c8.data._M_elems[0x18] = 0;
    local_6c8.data._M_elems[0x19] = 0;
    local_6c8.data._M_elems._104_5_ = 0;
    local_6c8.data._M_elems[0x1b]._1_3_ = 0;
    local_6c8.exp = 0;
    local_6c8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_6c8,&pnVar4[i].m_backend,&local_5b8);
    pcVar12 = &local_6c8;
    puVar15 = (uint *)&local_638;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar15 = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
    }
    iStack_5c8 = local_6c8.exp;
    bStack_5c4 = local_6c8.neg;
    goto LAB_004df80e;
  case P_ON_UPPER:
    pnVar16 = newLower;
    pnVar19 = &local_130;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = (newLower->m_backend).exp;
    local_130.m_backend.neg = (newLower->m_backend).neg;
    local_130.m_backend.fpclass = (newLower->m_backend).fpclass;
    local_130.m_backend.prec_elem = (newLower->m_backend).prec_elem;
    pcVar12 = &local_538;
    pnVar16 = &local_1b0;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = iVar7;
    local_1b0.m_backend.neg = bVar6;
    local_1b0.m_backend.fpclass = fVar1;
    local_1b0.m_backend.prec_elem = iVar2;
    RVar5 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar6 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_130,&local_1b0,RVar5);
    if (bVar6) {
      pSVar3[i] = P_FIXED;
    }
    break;
  case P_FREE:
    ::soplex::infinity::__tls_init();
    local_6c8.fpclass = cpp_dec_float_finite;
    local_6c8.prec_elem = 0x1c;
    local_6c8.data._M_elems[0] = 0;
    local_6c8.data._M_elems[1] = 0;
    local_6c8.data._M_elems[2] = 0;
    local_6c8.data._M_elems[3] = 0;
    local_6c8.data._M_elems[4] = 0;
    local_6c8.data._M_elems[5] = 0;
    local_6c8.data._M_elems[6] = 0;
    local_6c8.data._M_elems[7] = 0;
    local_6c8.data._M_elems[8] = 0;
    local_6c8.data._M_elems[9] = 0;
    local_6c8.data._M_elems[10] = 0;
    local_6c8.data._M_elems[0xb] = 0;
    local_6c8.data._M_elems[0xc] = 0;
    local_6c8.data._M_elems[0xd] = 0;
    local_6c8.data._M_elems[0xe] = 0;
    local_6c8.data._M_elems[0xf] = 0;
    local_6c8.data._M_elems[0x10] = 0;
    local_6c8.data._M_elems[0x11] = 0;
    local_6c8.data._M_elems[0x12] = 0;
    local_6c8.data._M_elems[0x13] = 0;
    local_6c8.data._M_elems[0x14] = 0;
    local_6c8.data._M_elems[0x15] = 0;
    local_6c8.data._M_elems[0x16] = 0;
    local_6c8.data._M_elems[0x17] = 0;
    local_6c8.data._M_elems[0x18] = 0;
    local_6c8.data._M_elems[0x19] = 0;
    local_6c8.data._M_elems._104_5_ = 0;
    local_6c8.data._M_elems[0x1b]._1_3_ = 0;
    local_6c8.exp = 0;
    local_6c8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_6c8,-*(double *)(in_FS_OFFSET + -8));
    if (((((newLower->m_backend).fpclass == cpp_dec_float_NaN) ||
         (local_6c8.fpclass == cpp_dec_float_NaN)) ||
        (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&newLower->m_backend,&local_6c8), iVar7 < 1)) ||
       ((pSVar3[i] = P_ON_LOWER, this->m_nonbasicValueUpToDate != true || (this->theRep != COLUMN)))
       ) break;
    local_6c8.fpclass = cpp_dec_float_finite;
    local_6c8.prec_elem = 0x1c;
    local_6c8.data._M_elems[0] = 0;
    local_6c8.data._M_elems[1] = 0;
    local_6c8.data._M_elems[2] = 0;
    local_6c8.data._M_elems[3] = 0;
    local_6c8.data._M_elems[4] = 0;
    local_6c8.data._M_elems[5] = 0;
    local_6c8.data._M_elems[6] = 0;
    local_6c8.data._M_elems[7] = 0;
    local_6c8.data._M_elems[8] = 0;
    local_6c8.data._M_elems[9] = 0;
    local_6c8.data._M_elems[10] = 0;
    local_6c8.data._M_elems[0xb] = 0;
    local_6c8.data._M_elems[0xc] = 0;
    local_6c8.data._M_elems[0xd] = 0;
    local_6c8.data._M_elems[0xe] = 0;
    local_6c8.data._M_elems[0xf] = 0;
    local_6c8.data._M_elems[0x10] = 0;
    local_6c8.data._M_elems[0x11] = 0;
    local_6c8.data._M_elems[0x12] = 0;
    local_6c8.data._M_elems[0x13] = 0;
    local_6c8.data._M_elems[0x14] = 0;
    local_6c8.data._M_elems[0x15] = 0;
    local_6c8.data._M_elems[0x16] = 0;
    local_6c8.data._M_elems[0x17] = 0;
    local_6c8.data._M_elems[0x18] = 0;
    local_6c8.data._M_elems[0x19] = 0;
    local_6c8.data._M_elems._104_5_ = 0;
    local_6c8.data._M_elems[0x1b]._1_3_ = 0;
    local_6c8.exp = 0;
    local_6c8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_6c8,
               &(this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&newLower->m_backend);
    pcVar12 = &local_6c8;
    puVar15 = (uint *)&local_638;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar15 = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
    }
    iStack_5c8 = local_6c8.exp;
    bStack_5c4 = local_6c8.neg;
LAB_004df80e:
    local_5c0._0_4_ = local_6c8.fpclass;
    local_5c0._4_4_ = local_6c8.prec_elem;
    local_6c8.exp = iStack_5c8;
    local_6c8.neg = (bool)bStack_5c4;
  }
  if (this->theRep == COLUMN) {
    puVar15 = (uint *)&local_638;
    pnVar16 = &local_330;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = *puVar15;
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = iStack_5c8;
    local_330.m_backend.neg = (bool)bStack_5c4;
    local_330.m_backend.fpclass = (fpclass_type)local_5c0;
    local_330.m_backend.prec_elem = local_5c0._4_4_;
    updateNonbasicValue(this,&local_330);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeLowerStatus(int i, R newLower, R oldLower)
{
   typename SPxBasisBase<R>::Desc::Status& stat      = this->desc().colStatus(i);
   R                    currUpper = this->upper(i);
   R                    objChange = 0.0;

   SPxOut::debug(this, "DCHANG01 changeLowerStatus(): col {} [{}:{}] {}", i, newLower, currUpper,
                 stat);

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      if(newLower <= R(-infinity))
      {
         if(currUpper >= R(infinity))
         {
            stat = SPxBasisBase<R>::Desc::P_FREE;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = -theLCbound[i] * oldLower;
         }
         else
         {
            stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = (theUCbound[i] * currUpper) - (theLCbound[i] * oldLower);
         }
      }
      else if(EQ(newLower, currUpper, R(this->tolerances()->epsilon())))
      {
         stat = SPxBasisBase<R>::Desc::P_FIXED;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = this->maxObj(i) * (newLower - oldLower);
      }
      else if(m_nonbasicValueUpToDate && rep() == COLUMN)
         objChange = theLCbound[i] * (newLower - oldLower);

      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      if(EQ(newLower, currUpper, this->tolerances()->epsilon()))
         stat = SPxBasisBase<R>::Desc::P_FIXED;

      break;

   case SPxBasisBase<R>::Desc::P_FREE:
      if(newLower > R(-infinity))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = theLCbound[i] * newLower;
      }

      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      if(NE(newLower, currUpper, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

         if(isInitialized())
            theUCbound[i] = this->maxObj(i);
      }

      break;

   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_UPPER:
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
   case SPxBasisBase<R>::Desc::D_ON_BOTH:
   case SPxBasisBase<R>::Desc::D_UNDEFINED:
      if(rep() == ROW && theShift > 0.0)
         forceRecompNonbasicValue();

      stat = this->dualColStatus(i);
      break;

   default:
      throw SPxInternalCodeException("XCHANG01 This should never happen.");
   }

   SPxOut::debug(this, " -> {}\n", stat);

   // we only need to update the nonbasic value in column representation (see nonbasicValue() for comparison/explanation)
   if(rep() == COLUMN)
      updateNonbasicValue(objChange);
}